

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.cpp
# Opt level: O1

void stk::Stk::handleError(string *message,Type type)

{
  ostream *poVar1;
  StkError *this;
  char local_1c [4];
  
  if (type < DEBUG_PRINT) {
    if (showWarnings_ == '\x01') {
      local_1c[0] = '\n';
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1c,1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(message->_M_dataplus)._M_p,message->_M_string_length);
      local_1c[1] = 10;
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1c + 1,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
    }
  }
  else if (type != DEBUG_PRINT) {
    if (printErrors_ == '\x01') {
      local_1c[2] = 10;
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,local_1c + 2,1);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(message->_M_dataplus)._M_p,message->_M_string_length);
      local_1c[3] = 10;
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1c + 3,1);
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    this = (StkError *)__cxa_allocate_exception(0x30);
    StkError::StkError(this,message,type);
    __cxa_throw(this,&StkError::typeinfo,StkError::~StkError);
  }
  return;
}

Assistant:

void Stk :: handleError( std::string message, StkError::Type type )
{
  if ( type == StkError::WARNING || type == StkError::STATUS ) {
    if ( !showWarnings_ ) return;
    std::cerr << '\n' << message << '\n' << std::endl;
  }
  else if (type == StkError::DEBUG_PRINT) {
#if defined(_STK_DEBUG_)
    std::cerr << '\n' << message << '\n' << std::endl;
#endif
  }
  else {
    if ( printErrors_ ) {
      // Print error message before throwing.
      std::cerr << '\n' << message << '\n' << std::endl;
    }
    throw StkError(message, type);
  }
}